

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::iterate(ShaderAtomicCompSwapCase *this)

{
  GLuint program;
  ShaderAtomicCompSwapCase *pSVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  void *pvVar8;
  TestError *pTVar9;
  deUint32 ndx;
  uint uVar10;
  int iVar11;
  char *description;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  Buffer inoutBuffer;
  InterfaceVariableInfo groupVarInfo;
  InterfaceVariableInfo outVarInfo;
  InterfaceVariableInfo exhVarInfo;
  InterfaceVariableInfo cmpVarInfo;
  InterfaceBlockInfo blockInfo;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufData;
  allocator_type local_375;
  int local_374;
  uint local_370;
  uint local_36c;
  ShaderAtomicCompSwapCase *local_368;
  Functions *local_360;
  void *local_358;
  ObjectWrapper local_350;
  InterfaceVariableInfo local_338;
  InterfaceVariableInfo local_2e8;
  InterfaceVariableInfo local_298;
  InterfaceVariableInfo local_248;
  InterfaceBlockInfo local_1f8;
  undefined1 local_1b0 [8];
  TestLog *local_1a8;
  pointer local_1a0;
  ios_base local_138 [264];
  Functions *pFVar7;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar7 = (Functions *)CONCAT44(extraout_var,iVar3);
  program = (this->m_program->m_program).m_program;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_350,(Functions *)CONCAT44(extraout_var_00,iVar3),traits);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e6,"InOut");
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  local_1f8.name._M_string_length = 0;
  local_1f8.name.field_2._M_local_buf[0] = '\0';
  local_1f8.index = 0xffffffff;
  local_1f8.bufferBinding = 0;
  local_1f8.dataSize = 0;
  local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glu::getProgramInterfaceBlockInfo(pFVar7,program,0x92e6,GVar4,&local_1f8);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e5,"InOut.compareValues[0]");
  local_248.name._M_dataplus._M_p = (pointer)&local_248.name.field_2;
  local_248.name._M_string_length = 0;
  local_248.name.field_2._M_local_buf[0] = '\0';
  local_248.index = 0xffffffff;
  local_248.blockIndex = 0xffffffff;
  local_248.atomicCounterBufferIndex = 0xffffffff;
  local_248.type = 0;
  local_248.arraySize = 0;
  local_248.offset = 0;
  local_248.arrayStride = 0;
  local_248._60_5_ = 0;
  local_248._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(pFVar7,program,0x92e5,GVar4,&local_248);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e5,"InOut.exchangeValues[0]");
  local_298.name._M_dataplus._M_p = (pointer)&local_298.name.field_2;
  local_298.name._M_string_length = 0;
  local_298.name.field_2._M_local_buf[0] = '\0';
  local_298.index = 0xffffffff;
  local_298.blockIndex = 0xffffffff;
  local_298.atomicCounterBufferIndex = 0xffffffff;
  local_298.type = 0;
  local_298.arraySize = 0;
  local_298.offset = 0;
  local_298.arrayStride = 0;
  local_298._60_5_ = 0;
  local_298._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(pFVar7,program,0x92e5,GVar4,&local_298);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e5,"InOut.outputValues[0]");
  local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
  local_2e8.name._M_string_length = 0;
  local_2e8.name.field_2._M_local_buf[0] = '\0';
  local_2e8.index = 0xffffffff;
  local_2e8.blockIndex = 0xffffffff;
  local_2e8.atomicCounterBufferIndex = 0xffffffff;
  local_2e8.type = 0;
  local_2e8.arraySize = 0;
  local_2e8.offset = 0;
  local_2e8.arrayStride = 0;
  local_2e8._60_5_ = 0;
  local_2e8._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(pFVar7,program,0x92e5,GVar4,&local_2e8);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e5,"InOut.groupValues[0]");
  local_338.name._M_dataplus._M_p = (pointer)&local_338.name.field_2;
  local_338.name._M_string_length = 0;
  local_338.name.field_2._M_local_buf[0] = '\0';
  local_338.index = 0xffffffff;
  local_338.blockIndex = 0xffffffff;
  local_338.atomicCounterBufferIndex = 0xffffffff;
  local_338.type = 0;
  local_338.arraySize = 0;
  local_338.offset = 0;
  local_338.arrayStride = 0;
  local_338._60_5_ = 0;
  local_338._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(pFVar7,program,0x92e5,GVar4,&local_338);
  dVar5 = (this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[0] *
          (this->m_numWorkGroups).m_data[2];
  uVar12 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
           (this->m_workGroupSize).m_data[2] * dVar5;
  if ((((local_248.arraySize != uVar12) || (local_298.arraySize != uVar12)) ||
      (local_2e8.arraySize != uVar12)) || (local_338.arraySize != dVar5)) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,
               "cmpVarInfo.arraySize == numValues && exhVarInfo.arraySize == numValues && outVarInfo.arraySize == numValues && groupVarInfo.arraySize == product(m_numWorkGroups)"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
               ,0x3f4);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pFVar7->useProgram)(program);
  uVar13 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
           (this->m_workGroupSize).m_data[2];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0,
             (ulong)local_1f8.dataSize,&local_375);
  if (local_1b0 != (undefined1  [8])local_1a8) {
    memset((void *)local_1b0,0,(long)local_1a8 - (long)local_1b0);
  }
  if (uVar12 != 0) {
    uVar10 = 0;
    do {
      *(uint *)((long)(qpTestLog **)local_1b0 +
               (ulong)(local_248.arrayStride * uVar10) + (ulong)local_248.offset) = uVar10 % uVar13;
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar10);
    uVar10 = 0;
    do {
      *(uint *)((long)(qpTestLog **)local_1b0 +
               (ulong)(local_298.arrayStride * uVar10) + (ulong)local_298.offset) =
           uVar10 % uVar13 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar10);
  }
  (*pFVar7->bindBuffer)(0x90d2,local_350.m_object);
  (*pFVar7->bufferData)(0x90d2,(ulong)local_1f8.dataSize,(void *)local_1b0,0x88e5);
  (*pFVar7->bindBufferBase)(0x90d2,0,local_350.m_object);
  GVar6 = (*pFVar7->getError)();
  glu::checkError(GVar6,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0x40a);
  if (local_1b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b0,(long)local_1a0 - (long)local_1b0);
  }
  (*pFVar7->dispatchCompute)
            ((this->m_numWorkGroups).m_data[0],(this->m_numWorkGroups).m_data[1],
             (this->m_numWorkGroups).m_data[2]);
  pvVar8 = (*pFVar7->mapBufferRange)(0x90d2,0,(ulong)local_1f8.dataSize,1);
  local_374 = (this->m_numWorkGroups).m_data[1] * (this->m_numWorkGroups).m_data[0] *
              (this->m_numWorkGroups).m_data[2];
  uVar12 = (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
           (this->m_workGroupSize).m_data[2];
  GVar6 = (*pFVar7->getError)();
  glu::checkError(GVar6,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0x416);
  if (pvVar8 == (void *)0x0) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,"resPtr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
               ,0x417);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_368 = this;
  local_360 = pFVar7;
  if (local_374 < 1) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    iVar14 = 0;
    iVar15 = 0;
    iVar3 = local_374;
    local_370 = uVar12;
    local_358 = pvVar8;
    do {
      local_36c = *(uint *)((long)local_358 +
                           (long)(local_338.arrayStride * iVar15) + (ulong)local_338.offset);
      if (0 < (int)local_370) {
        iVar11 = local_2e8.arrayStride * iVar14;
        uVar16 = 0;
        do {
          uVar13 = *(uint *)((long)local_358 + (long)iVar11 + (ulong)local_2e8.offset);
          if (uVar16 != uVar13) {
            local_1b0 = (undefined1  [8])
                        ((local_368->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
            ;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"ERROR: at group ",0x10);
            std::ostream::operator<<((ostringstream *)&local_1a8,iVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,", invocation ",0xd);
            std::ostream::operator<<((ostringstream *)&local_1a8,(int)uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,": expected ",0xb);
            std::ostream::operator<<((ostringstream *)&local_1a8,(int)uVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", got ",6);
            std::ostream::operator<<((ostringstream *)&local_1a8,uVar13);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar2 = false;
            iVar3 = local_374;
            break;
          }
          uVar16 = uVar16 + 1;
          iVar11 = iVar11 + local_2e8.arrayStride;
        } while (uVar12 != uVar16);
      }
      if (local_36c != local_370) {
        local_1b0 = (undefined1  [8])
                    ((local_368->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"ERROR: at group ",0x10);
        uVar13 = local_36c;
        uVar12 = local_370;
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,": expected",10);
        std::ostream::operator<<((ostringstream *)&local_1a8,uVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", got ",6);
        std::ostream::operator<<((ostringstream *)&local_1a8,uVar13);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar2 = false;
        break;
      }
      iVar15 = iVar15 + 1;
      iVar14 = iVar14 + local_370;
    } while (iVar15 != iVar3);
  }
  pFVar7 = local_360;
  (*local_360->unmapBuffer)(0x90d2);
  pSVar1 = local_368;
  GVar6 = (*pFVar7->getError)();
  glu::checkError(GVar6,"glUnmapBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0x436);
  description = "Comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pSVar1->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar2,
             description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338.name._M_dataplus._M_p != &local_338.name.field_2) {
    operator_delete(local_338.name._M_dataplus._M_p,
                    CONCAT71(local_338.name.field_2._M_allocated_capacity._1_7_,
                             local_338.name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.name._M_dataplus._M_p != &local_2e8.name.field_2) {
    operator_delete(local_2e8.name._M_dataplus._M_p,
                    CONCAT71(local_2e8.name.field_2._M_allocated_capacity._1_7_,
                             local_2e8.name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.name._M_dataplus._M_p != &local_298.name.field_2) {
    operator_delete(local_298.name._M_dataplus._M_p,
                    CONCAT71(local_298.name.field_2._M_allocated_capacity._1_7_,
                             local_298.name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.name._M_dataplus._M_p != &local_248.name.field_2) {
    operator_delete(local_248.name._M_dataplus._M_p,
                    CONCAT71(local_248.name.field_2._M_allocated_capacity._1_7_,
                             local_248.name.field_2._M_local_buf[0]) + 1);
  }
  if (local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    CONCAT71(local_1f8.name.field_2._M_allocated_capacity._1_7_,
                             local_1f8.name.field_2._M_local_buf[0]) + 1);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_350);
  return STOP;
}

Assistant:

ShaderAtomicOpCase::IterateResult ShaderAtomicCompSwapCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	const Buffer				inoutBuffer		(m_context.getRenderContext());
	const deUint32				blockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "InOut");
	const InterfaceBlockInfo	blockInfo		= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, blockNdx);
	const deUint32				cmpVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.compareValues[0]");
	const InterfaceVariableInfo	cmpVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, cmpVarNdx);
	const deUint32				exhVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.exchangeValues[0]");
	const InterfaceVariableInfo	exhVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, exhVarNdx);
	const deUint32				outVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.outputValues[0]");
	const InterfaceVariableInfo	outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarNdx);
	const deUint32				groupVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.groupValues[0]");
	const InterfaceVariableInfo	groupVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, groupVarNdx);
	const deUint32				numValues		= product(m_workGroupSize)*product(m_numWorkGroups);

	TCU_CHECK(cmpVarInfo.arraySize == numValues &&
			  exhVarInfo.arraySize == numValues &&
			  outVarInfo.arraySize == numValues &&
			  groupVarInfo.arraySize == product(m_numWorkGroups));

	gl.useProgram(program);

	// \todo [2013-09-05 pyry] Use randomized input values!

	// Setup buffer.
	{
		const deUint32	workGroupSize	= product(m_workGroupSize);
		vector<deUint8>	bufData			(blockInfo.dataSize);

		std::fill(bufData.begin(), bufData.end(), 0);

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
			*(deUint32*)(&bufData[0] + cmpVarInfo.offset + cmpVarInfo.arrayStride*ndx) = ndx%workGroupSize;

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
			*(deUint32*)(&bufData[0] + exhVarInfo.offset + exhVarInfo.arrayStride*ndx) = (ndx%workGroupSize)+1;

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inoutBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockInfo.dataSize, &bufData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *inoutBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());

	// Read back and compare
	{
		const void*		resPtr			= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, blockInfo.dataSize, GL_MAP_READ_BIT);
		const int		numWorkGroups	= (int)product(m_numWorkGroups);
		const int		workGroupSize	= (int)product(m_workGroupSize);
		bool			isOk			= true;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)resPtr + groupVarInfo.offset + groupNdx*groupVarInfo.arrayStride);

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int	refValue		= localNdx;
				const int	outputValue		= *(const deInt32*)((const deUint8*)resPtr + outVarInfo.offset + outVarInfo.arrayStride*(groupOffset+localNdx));

				if (outputValue != refValue)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": expected " << refValue << ", got " << outputValue
									   << TestLog::EndMessage;
					isOk = false;
					break;
				}
			}

			if (groupOutput != workGroupSize)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected" << workGroupSize << ", got " << groupOutput << TestLog::EndMessage;
				isOk = false;
				break;
			}
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Comparison failed");
	}

	return STOP;
}